

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui.cpp
# Opt level: O1

void ImGui::ClosePopupsOverWindow(ImGuiWindow *ref_window,bool restore_focus_to_window_under_popup)

{
  uint uVar1;
  uint uVar2;
  ImGuiPopupData *pIVar3;
  ImGuiWindow *pIVar4;
  ulong uVar5;
  ulong uVar6;
  ImGuiWindow **ppIVar7;
  ImGuiWindow **ppIVar8;
  ulong uVar9;
  bool bVar10;
  ulong uVar11;
  bool bVar12;
  
  uVar1 = (GImGui->OpenPopupStack).Size;
  uVar6 = (ulong)uVar1;
  if (uVar6 != 0) {
    uVar5 = 0;
    if (0 < (int)uVar1 && ref_window != (ImGuiWindow *)0x0) {
      pIVar3 = (GImGui->OpenPopupStack).Data;
      ppIVar8 = &pIVar3->Window;
      uVar9 = 1;
      uVar5 = 0;
      do {
        pIVar4 = pIVar3[uVar5].Window;
        if (pIVar4 != (ImGuiWindow *)0x0) {
          uVar2 = pIVar4->Flags;
          if ((uVar2 >> 0x1a & 1) == 0) {
            __assert_fail("(popup.Window->Flags & ImGuiWindowFlags_Popup) != 0",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/Bktero[P]HelloWorldWithDearImGui/build_O1/_deps/imgui-src/imgui.cpp"
                          ,0x1f3a,"void ImGui::ClosePopupsOverWindow(ImGuiWindow *, bool)");
          }
          if ((uVar2 >> 0x18 & 1) == 0) {
            bVar10 = false;
            ppIVar7 = ppIVar8;
            uVar11 = uVar9;
            do {
              if ((*ppIVar7 == (ImGuiWindow *)0x0) ||
                 ((*ppIVar7)->RootWindow != ref_window->RootWindow)) {
                bVar12 = true;
              }
              else {
                bVar10 = true;
                bVar12 = false;
              }
              if (!bVar12) break;
              ppIVar7 = ppIVar7 + 6;
              bVar12 = uVar11 < uVar6;
              uVar11 = uVar11 + 1;
            } while (bVar12);
            if (!bVar10) goto LAB_0011bc0c;
          }
        }
        uVar5 = uVar5 + 1;
        ppIVar8 = ppIVar8 + 6;
        uVar9 = uVar9 + 1;
      } while (uVar5 != uVar6);
      uVar5 = (ulong)uVar1;
    }
LAB_0011bc0c:
    if ((int)uVar5 < (int)uVar1) {
      ClosePopupToLevel((int)uVar5,restore_focus_to_window_under_popup);
      return;
    }
  }
  return;
}

Assistant:

void ImGui::ClosePopupsOverWindow(ImGuiWindow* ref_window, bool restore_focus_to_window_under_popup)
{
    ImGuiContext& g = *GImGui;
    if (g.OpenPopupStack.Size == 0)
        return;

    // Don't close our own child popup windows.
    int popup_count_to_keep = 0;
    if (ref_window)
    {
        // Find the highest popup which is a descendant of the reference window (generally reference window = NavWindow)
        for (; popup_count_to_keep < g.OpenPopupStack.Size; popup_count_to_keep++)
        {
            ImGuiPopupData& popup = g.OpenPopupStack[popup_count_to_keep];
            if (!popup.Window)
                continue;
            IM_ASSERT((popup.Window->Flags & ImGuiWindowFlags_Popup) != 0);
            if (popup.Window->Flags & ImGuiWindowFlags_ChildWindow)
                continue;

            // Trim the stack unless the popup is a direct parent of the reference window (the reference window is often the NavWindow)
            // - With this stack of window, clicking/focusing Popup1 will close Popup2 and Popup3:
            //     Window -> Popup1 -> Popup2 -> Popup3
            // - Each popups may contain child windows, which is why we compare ->RootWindow!
            //     Window -> Popup1 -> Popup1_Child -> Popup2 -> Popup2_Child
            bool ref_window_is_descendent_of_popup = false;
            for (int n = popup_count_to_keep; n < g.OpenPopupStack.Size; n++)
                if (ImGuiWindow* popup_window = g.OpenPopupStack[n].Window)
                    if (popup_window->RootWindow == ref_window->RootWindow)
                    {
                        ref_window_is_descendent_of_popup = true;
                        break;
                    }
            if (!ref_window_is_descendent_of_popup)
                break;
        }
    }
    if (popup_count_to_keep < g.OpenPopupStack.Size) // This test is not required but it allows to set a convenient breakpoint on the statement below
    {
        IMGUI_DEBUG_LOG_POPUP("ClosePopupsOverWindow(\"%s\") -> ClosePopupToLevel(%d)\n", ref_window->Name, popup_count_to_keep);
        ClosePopupToLevel(popup_count_to_keep, restore_focus_to_window_under_popup);
    }
}